

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.c
# Opt level: O2

int mbedtls_arc4_self_test(int verbose)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uchar ibuf [8];
  uchar obuf [8];
  mbedtls_arc4_context ctx;
  
  memset(&ctx,0,0x108);
  uVar1 = 1;
  lVar3 = 0;
  do {
    if (lVar3 == 0x18) {
      iVar2 = 0;
      if (verbose != 0) {
        putchar(10);
      }
LAB_00126652:
      mbedtls_arc4_free(&ctx);
      return iVar2;
    }
    if (verbose != 0) {
      printf("  ARC4 test #%d: ",(ulong)uVar1);
    }
    ibuf = *(uchar (*) [8])(arc4_test_pt[0] + lVar3);
    mbedtls_arc4_setup(&ctx,arc4_test_key[0] + lVar3,8);
    mbedtls_arc4_crypt(&ctx,8,ibuf,obuf);
    if (obuf != *(uchar (*) [8])(arc4_test_ct[0] + lVar3)) {
      iVar2 = 1;
      if (verbose != 0) {
        puts("failed");
      }
      goto LAB_00126652;
    }
    if (verbose != 0) {
      puts("passed");
    }
    uVar1 = uVar1 + 1;
    lVar3 = lVar3 + 8;
  } while( true );
}

Assistant:

int mbedtls_arc4_self_test( int verbose )
{
    int i, ret = 0;
    unsigned char ibuf[8];
    unsigned char obuf[8];
    mbedtls_arc4_context ctx;

    mbedtls_arc4_init( &ctx );

    for( i = 0; i < 3; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  ARC4 test #%d: ", i + 1 );

        memcpy( ibuf, arc4_test_pt[i], 8 );

        mbedtls_arc4_setup( &ctx, arc4_test_key[i], 8 );
        mbedtls_arc4_crypt( &ctx, 8, ibuf, obuf );

        if( memcmp( obuf, arc4_test_ct[i], 8 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_arc4_free( &ctx );

    return( ret );
}